

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall
Commands::Commands(Commands *this,transparent_set<Command> *commands_,
                  insensitive_map<std::string,_std::vector<const_Command_*>_> *alternators_,
                  transparent_map<std::string,_EntityType> *entities_,
                  transparent_map<std::string,_shared_ptr<Enum>_> *enums_)

{
  _Rb_tree_header *this_00;
  _Rb_tree_header *p_Var1;
  transparent_map<std::string,_shared_ptr<Enum>_> *this_01;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
  *this_02;
  _Rb_tree<unsigned_short,std::pair<unsigned_short_const,Command_const*>,std::_Select1st<std::pair<unsigned_short_const,Command_const*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,Command_const*>>>
  *this_03;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  Command *pCVar10;
  transparent_set<Command> *__range1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Enum>_>_>_>
  *__const_this;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
  *local_50;
  _Rb_tree<unsigned_short,std::pair<unsigned_short_const,Command_const*>,std::_Select1st<std::pair<unsigned_short_const,Command_const*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,Command_const*>>>
  *local_48;
  transparent_map<std::string,_shared_ptr<Enum>_> *local_40;
  _Base_ptr local_38;
  
  this_00 = &(this->commands)._M_t._M_impl.super__Rb_tree_header;
  std::_Rb_tree_header::_Rb_tree_header(this_00,&(commands_->_M_t)._M_impl.super__Rb_tree_header);
  local_50 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              *)&this->alternators;
  local_38 = &(this->alternators)._M_t._M_impl.super__Rb_tree_header._M_header;
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)local_38,&(alternators_->_M_t)._M_impl.super__Rb_tree_header);
  local_48 = (_Rb_tree<unsigned_short,std::pair<unsigned_short_const,Command_const*>,std::_Select1st<std::pair<unsigned_short_const,Command_const*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,Command_const*>>>
              *)&this->commands_by_id;
  p_Var1 = &(this->commands_by_id)._M_t._M_impl.super__Rb_tree_header;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->commands_by_id)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = &this->enums;
  p_Var1 = &(this->enums)._M_t._M_impl.super__Rb_tree_header;
  std::_Rb_tree_header::_Rb_tree_header(p_Var1,&(enums_->_M_t)._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->entities)._M_t._M_impl.super__Rb_tree_header,
             &(entities_->_M_t)._M_impl.super__Rb_tree_header);
  memset(&this->enum_models,0,0x198);
  local_40 = this_01;
  cVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
          ::_M_find_tr<char[13],void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
                      *)this_01,(char (*) [13])"DEFAULTMODEL");
  cVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
          ::_M_find_tr<char[6],void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
                      *)this_01,(char (*) [6])0x1dcf47);
  cVar5 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
          ::_M_find_tr<char[13],void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Enum>>>>
                      *)this_01,(char (*) [13])"SCRIPTSTREAM");
  if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
    __assert_fail("it_model != this->enums.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp"
                  ,0x12,
                  "Commands::Commands(transparent_set<Command> &&, insensitive_map<std::string, std::vector<const Command *>> &&, transparent_map<std::string, EntityType> &&, transparent_map<std::string, shared_ptr<Enum>> &&)"
                 );
  }
  if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
    if ((_Rb_tree_header *)cVar5._M_node != p_Var1) {
      (this->enum_models).super___shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(cVar4._M_node + 2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->enum_models).super___shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cVar4._M_node[2]._M_parent);
      (this->enum_defaultmodels).super___shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(cVar3._M_node + 2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->enum_defaultmodels).super___shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cVar3._M_node[2]._M_parent);
      (this->enum_scriptstream).super___shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(cVar5._M_node + 2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->enum_scriptstream).super___shared_ptr<Enum,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cVar5._M_node[2]._M_parent);
      this_03 = local_48;
      p_Var6 = (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var6 != this_00) {
        do {
          if (p_Var6[1].field_0x4 == '\x01') {
            local_60.__data = (value_type *)(p_Var6 + 1);
            std::
            _Rb_tree<unsigned_short,std::pair<unsigned_short_const,Command_const*>,std::_Select1st<std::pair<unsigned_short_const,Command_const*>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,Command_const*>>>
            ::_M_emplace_equal<unsigned_short_const&,Command_const*>
                      (this_03,(unsigned_short *)&p_Var6[1].field_0x6,(Command **)&local_60);
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while ((_Rb_tree_header *)p_Var6 != this_00);
      }
      local_60.__data = "SET_PROGRESS_TOTAL";
      local_60.__size = 0x12;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      this_02 = local_50;
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->set_progress_total).ref = pCVar10;
      local_60.__data = "SET_TOTAL_NUMBER_OF_MISSIONS";
      local_60.__size = 0x1c;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      p_Var2 = local_38;
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->set_total_number_of_missions).ref = pCVar10;
      local_60.__data = "SET_COLLECTABLE1_TOTAL";
      local_60.__size = 0x16;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->set_collectable1_total).ref = pCVar10;
      local_60.__data = "SET_MISSION_RESPECT_TOTAL";
      local_60.__size = 0x19;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->set_mission_respect_total).ref = pCVar10;
      local_60.__data = "REGISTER_MISSION_PASSED";
      local_60.__size = 0x17;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->register_mission_passed).ref = pCVar10;
      local_60.__data = "REGISTER_ODDJOB_MISSION_PASSED";
      local_60.__size = 0x1e;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->register_oddjob_mission_passed).ref = pCVar10;
      local_60.__data = "CREATE_COLLECTABLE1";
      local_60.__size = 0x13;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->create_collectable1).ref = pCVar10;
      local_60.__data = "AWARD_PLAYER_MISSION_RESPECT";
      local_60.__size = 0x1c;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->award_player_mission_respect).ref = pCVar10;
      local_60.__data = "PLAYER_MADE_PROGRESS";
      local_60.__size = 0x14;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->player_made_progress).ref = pCVar10;
      local_60.__data = "REPEAT";
      local_60.__size = 6;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->repeat).ref = pCVar10;
      local_60.__data = "SWITCH";
      local_60.__size = 6;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->switch_).ref = pCVar10;
      local_60.__data = "CASE";
      local_60.__size = 4;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->case_).ref = pCVar10;
      local_60.__data = "SWITCH_START";
      local_60.__size = 0xc;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->switch_start).ref = pCVar10;
      local_60.__data = "SWITCH_CONTINUED";
      local_60.__size = 0x10;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->switch_continued).ref = pCVar10;
      local_60.__data = "GOSUB_FILE";
      local_60.__size = 10;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->gosub_file).ref = pCVar10;
      local_60.__data = "LAUNCH_MISSION";
      local_60.__size = 0xe;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->launch_mission).ref = pCVar10;
      local_60.__data = "LOAD_AND_LAUNCH_MISSION_INTERNAL";
      local_60.__size = 0x20;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->load_and_launch_mission_internal).ref = pCVar10;
      local_60.__data = "START_NEW_SCRIPT";
      local_60.__size = 0x10;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->start_new_script).ref = pCVar10;
      local_60.__data = "START_NEW_STREAMED_SCRIPT";
      local_60.__size = 0x19;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->start_new_streamed_script).ref = pCVar10;
      local_60.__data = "TERMINATE_THIS_SCRIPT";
      local_60.__size = 0x15;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->terminate_this_script).ref = pCVar10;
      local_60.__data = "SCRIPT_NAME";
      local_60.__size = 0xb;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->script_name).ref = pCVar10;
      local_60.__data = "RETURN";
      local_60.__size = 6;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->return_).ref = pCVar10;
      local_60.__data = "CLEO_CALL";
      local_60.__size = 9;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->cleo_call).ref = pCVar10;
      local_60.__data = "CLEO_RETURN";
      local_60.__size = 0xb;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->cleo_return).ref = pCVar10;
      local_60.__data = "TERMINATE_THIS_CUSTOM_SCRIPT";
      local_60.__size = 0x1c;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->terminate_this_custom_script).ref = pCVar10;
      local_60.__data = "GOTO";
      local_60.__size = 4;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->goto_).ref = pCVar10;
      local_60.__data = "GOTO_IF_FALSE";
      local_60.__size = 0xd;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->goto_if_false).ref = pCVar10;
      local_60.__data = "ANDOR";
      local_60.__size = 5;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->andor).ref = pCVar10;
      local_60.__data = "SAVE_STRING_TO_DEBUG_FILE";
      local_60.__size = 0x19;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->save_string_to_debug_file).ref = pCVar10;
      local_60.__data = "SKIP_CUTSCENE_START";
      local_60.__size = 0x13;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->skip_cutscene_start).ref = pCVar10;
      local_60.__data = "SKIP_CUTSCENE_END";
      local_60.__size = 0x11;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->skip_cutscene_end).ref = pCVar10;
      local_60.__data = "SKIP_CUTSCENE_START_INTERNAL";
      local_60.__size = 0x1c;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->skip_cutscene_start_internal).ref = pCVar10;
      local_60.__data = "SET";
      local_60.__size = 3;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->set).ref = (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "CSET";
      local_60.__size = 4;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->cset).ref = (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "ADD_THING_TO_THING";
      local_60.__size = 0x12;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->add_thing_to_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "SUB_THING_FROM_THING";
      local_60.__size = 0x14;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->sub_thing_from_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "MULT_THING_BY_THING";
      local_60.__size = 0x13;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->mult_thing_by_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "DIV_THING_BY_THING";
      local_60.__size = 0x12;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->div_thing_by_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "ADD_THING_TO_THING_TIMED";
      local_60.__size = 0x18;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->add_thing_to_thing_timed).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "SUB_THING_FROM_THING_TIMED";
      local_60.__size = 0x1a;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->sub_thing_from_thing_timed).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "IS_THING_EQUAL_TO_THING";
      local_60.__size = 0x17;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->is_thing_equal_to_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "IS_THING_GREATER_THAN_THING";
      local_60.__size = 0x1b;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->is_thing_greater_than_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "IS_THING_GREATER_OR_EQUAL_TO_THING";
      local_60.__size = 0x22;
      cVar8 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>,iless,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Command_const*,std::allocator<Command_const*>>>>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        (this_02,&local_60);
      p_Var9 = (_Base_ptr)0x0;
      if (cVar8._M_node != p_Var2) {
        p_Var9 = cVar8._M_node + 2;
      }
      (this->is_thing_greater_or_equal_to_thing).ref =
           (vector<const_Command_*,_std::allocator<const_Command_*>_> *)p_Var9;
      local_60.__data = "REGISTER_STREAMED_SCRIPT_INTERNAL";
      local_60.__size = 0x21;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->register_streamed_script_internal).ref = pCVar10;
      local_60.__data = "REQUIRE";
      local_60.__size = 7;
      cVar7 = std::
              _Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
              ::_M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                        ((_Rb_tree<Command,Command,std::_Identity<Command>,std::less<void>,std::allocator<Command>>
                          *)this,&local_60);
      pCVar10 = (Command *)0x0;
      if ((_Rb_tree_header *)cVar7._M_node != this_00) {
        pCVar10 = (Command *)(cVar7._M_node + 1);
      }
      (this->require).ref = pCVar10;
      return;
    }
    __assert_fail("it_scriptstream != this->enums.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp"
                  ,0x14,
                  "Commands::Commands(transparent_set<Command> &&, insensitive_map<std::string, std::vector<const Command *>> &&, transparent_map<std::string, EntityType> &&, transparent_map<std::string, shared_ptr<Enum>> &&)"
                 );
  }
  __assert_fail("it_defaultmodel != this->enums.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp"
                ,0x13,
                "Commands::Commands(transparent_set<Command> &&, insensitive_map<std::string, std::vector<const Command *>> &&, transparent_map<std::string, EntityType> &&, transparent_map<std::string, shared_ptr<Enum>> &&)"
               );
}

Assistant:

Commands::Commands(transparent_set<Command>&& commands_,
                   insensitive_map<std::string, std::vector<const Command*>>&& alternators_,
                   transparent_map<std::string, EntityType>&& entities_,
                   transparent_map<std::string, shared_ptr<Enum>>&& enums_)

    : commands(std::move(commands_)), alternators(std::move(alternators_)),
      enums(std::move(enums_)), entities(std::move(entities_))
{
    auto it_defaultmodel = this->enums.find("DEFAULTMODEL");
    auto it_model       = this->enums.find("MODEL");
    auto it_scriptstream= this->enums.find("SCRIPTSTREAM");

    assert(it_model != this->enums.end());
    assert(it_defaultmodel != this->enums.end());
    assert(it_scriptstream != this->enums.end());

    this->enum_models = it_model->second;
    this->enum_defaultmodels = it_defaultmodel->second;
    this->enum_scriptstream = it_scriptstream->second;
    
    for(auto& cmd : this->commands)
    {
        if(cmd.id)
            this->commands_by_id.emplace(*cmd.id, std::addressof(cmd));
    }

    this->set_progress_total            = find_command("SET_PROGRESS_TOTAL");
    this->set_total_number_of_missions  = find_command("SET_TOTAL_NUMBER_OF_MISSIONS");
    this->set_collectable1_total        = find_command("SET_COLLECTABLE1_TOTAL");
    this->set_mission_respect_total     = find_command("SET_MISSION_RESPECT_TOTAL");
    this->register_mission_passed       = find_command("REGISTER_MISSION_PASSED");
    this->register_oddjob_mission_passed= find_command("REGISTER_ODDJOB_MISSION_PASSED");
    this->create_collectable1           = find_command("CREATE_COLLECTABLE1");
    this->award_player_mission_respect  = find_command("AWARD_PLAYER_MISSION_RESPECT");
    this->player_made_progress          = find_command("PLAYER_MADE_PROGRESS");
    this->repeat                        = find_command("REPEAT");
    this->switch_                       = find_command("SWITCH");
    this->case_                         = find_command("CASE");
    this->switch_start                  = find_command("SWITCH_START");
    this->switch_continued              = find_command("SWITCH_CONTINUED");
    this->gosub_file                    = find_command("GOSUB_FILE");
    this->launch_mission                = find_command("LAUNCH_MISSION");
    this->load_and_launch_mission_internal = find_command("LOAD_AND_LAUNCH_MISSION_INTERNAL");
    this->start_new_script              = find_command("START_NEW_SCRIPT");
    this->start_new_streamed_script     = find_command("START_NEW_STREAMED_SCRIPT");
    this->terminate_this_script         = find_command("TERMINATE_THIS_SCRIPT");
    this->script_name                   = find_command("SCRIPT_NAME");
    this->return_                        = find_command("RETURN");
    this->cleo_call                     = find_command("CLEO_CALL");
    this->cleo_return                   = find_command("CLEO_RETURN");
    this->terminate_this_custom_script  = find_command("TERMINATE_THIS_CUSTOM_SCRIPT");
    this->goto_                          = find_command("GOTO");
    this->goto_if_false                 = find_command("GOTO_IF_FALSE");
    this->andor                         = find_command("ANDOR");
    this->save_string_to_debug_file     = find_command("SAVE_STRING_TO_DEBUG_FILE");
    this->skip_cutscene_start           = find_command("SKIP_CUTSCENE_START");
    this->skip_cutscene_end             = find_command("SKIP_CUTSCENE_END");
    this->skip_cutscene_start_internal  = find_command("SKIP_CUTSCENE_START_INTERNAL");
    this->set                           = find_alternator("SET");
    this->cset                          = find_alternator("CSET");
    this->add_thing_to_thing            = find_alternator("ADD_THING_TO_THING");
    this->sub_thing_from_thing          = find_alternator("SUB_THING_FROM_THING");
    this->mult_thing_by_thing           = find_alternator("MULT_THING_BY_THING");
    this->div_thing_by_thing            = find_alternator("DIV_THING_BY_THING");
    this->add_thing_to_thing_timed      = find_alternator("ADD_THING_TO_THING_TIMED");
    this->sub_thing_from_thing_timed    = find_alternator("SUB_THING_FROM_THING_TIMED");
    this->is_thing_equal_to_thing       = find_alternator("IS_THING_EQUAL_TO_THING");
    this->is_thing_greater_than_thing   = find_alternator("IS_THING_GREATER_THAN_THING");
    this->is_thing_greater_or_equal_to_thing = find_alternator("IS_THING_GREATER_OR_EQUAL_TO_THING");
    this->register_streamed_script_internal = find_command("REGISTER_STREAMED_SCRIPT_INTERNAL");
    this->require                       = find_command("REQUIRE");
}